

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedNames.cpp
# Opt level: O3

void __thiscall wasm::RemoveUnusedNames::visitFunction(RemoveUnusedNames *this,Function *curr)

{
  pair<std::_Rb_tree_iterator<std::pair<const_wasm::Name,_std::set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>_>,_std::_Rb_tree_iterator<std::pair<const_wasm::Name,_std::set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>_>_>
  pVar1;
  
  pVar1 = std::
          _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>_>_>
          ::equal_range(&(this->branchesSeen)._M_t,(key_type *)&DELEGATE_CALLER_TARGET);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::set<wasm::Expression_*,_std::less<wasm::Expression_*>,_std::allocator<wasm::Expression_*>_>_>_>_>
  ::_M_erase_aux(&(this->branchesSeen)._M_t,(_Base_ptr)pVar1.first._M_node,
                 (_Base_ptr)pVar1.second._M_node);
  if ((this->branchesSeen)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    return;
  }
  __assert_fail("branchesSeen.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/RemoveUnusedNames.cpp"
                ,0x62,"void wasm::RemoveUnusedNames::visitFunction(Function *)");
}

Assistant:

void visitFunction(Function* curr) {
    // When we reach the function body we can erase delegations to the caller.
    branchesSeen.erase(DELEGATE_CALLER_TARGET);
    assert(branchesSeen.empty());
  }